

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.cpp
# Opt level: O1

BOOL GetCPInfo(UINT CodePage,LPCPINFO lpCPInfo)

{
  BOOL BVar1;
  
  if (!PAL_InitializeChakraCoreCalled) goto LAB_0033538e;
  if (CodePage == 0) {
LAB_0033531e:
    if (lpCPInfo == (LPCPINFO)0x0) goto LAB_0033536b;
    if ((CodePage == 0xfde9) || (BVar1 = 0, CodePage == 0)) {
      lpCPInfo->MaxCharSize = 4;
      memcpy(lpCPInfo->LeadByte,CP_TO_NATIVE_TABLE[0].LeadByte,0xc);
      memset(lpCPInfo->DefaultChar,0x3f,2);
      BVar1 = 1;
    }
  }
  else {
    BVar1 = IsValidCodePage(CodePage);
    if (BVar1 != 0) goto LAB_0033531e;
LAB_0033536b:
    if (PAL_InitializeChakraCoreCalled == false) goto LAB_0033538e;
    SetLastError(0x57);
    BVar1 = 0;
  }
  if (PAL_InitializeChakraCoreCalled != false) {
    return BVar1;
  }
LAB_0033538e:
  abort();
}

Assistant:

BOOL
PALAPI
GetCPInfo(
  IN UINT CodePage,
  OUT LPCPINFO lpCPInfo)
{
    const CP_MAPPING * lpStruct = NULL;
    BOOL bRet = FALSE;

    PERF_ENTRY(GetCPInfo);
    ENTRY("GetCPInfo(CodePage=%hu, lpCPInfo=%p)\n", CodePage, lpCPInfo);

    /*check if the input code page is valid*/
    if( CP_ACP != CodePage && !IsValidCodePage( CodePage ) )
    {
        /* error, invalid argument */
        ERROR("CodePage(%d) parameter is invalid\n",CodePage);
        SetLastError( ERROR_INVALID_PARAMETER );
        goto done;
    }

    /*check if the lpCPInfo parameter is valid. */
    if( !lpCPInfo )
    {
        /* error, invalid argument */
        ERROR("lpCPInfo cannot be NULL\n" );
        SetLastError( ERROR_INVALID_PARAMETER );
        goto done;
    }

    if ( NULL != ( lpStruct = CODEPAGEGetData( CodePage ) ) )
    {
        lpCPInfo->MaxCharSize = lpStruct->nMaxByteSize;;
        memcpy( lpCPInfo->LeadByte, lpStruct->LeadByte , MAX_LEADBYTES );

        /* Don't need to be set, according to the spec. */
        memset( lpCPInfo->DefaultChar, '?', MAX_DEFAULTCHAR );

        bRet = TRUE;
    }

done:
    LOGEXIT("GetCPInfo returns BOOL %d \n",bRet);
    PERF_EXIT(GetCPInfo);
    return bRet;
}